

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

void __thiscall
LinkedObjectFile::pointer_link_split_word
          (LinkedObjectFile *this,int source_segment,int source_hi_offset,int source_lo_offset,
          int dest_segment,int dest_offset)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  
  if ((source_hi_offset & 3U) != 0) {
    __assert_fail("(source_hi_offset % 4) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0xa3,"void LinkedObjectFile::pointer_link_split_word(int, int, int, int, int)");
  }
  if ((source_lo_offset & 3U) != 0) {
    __assert_fail("(source_lo_offset % 4) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0xa4,"void LinkedObjectFile::pointer_link_split_word(int, int, int, int, int)");
  }
  pvVar2 = std::
           vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
           ::at(&this->words_by_seg,(long)source_segment);
  pvVar3 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                     (pvVar2,(long)(source_hi_offset >> 2));
  pvVar2 = std::
           vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
           ::at(&this->words_by_seg,(long)source_segment);
  pvVar4 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                     (pvVar2,(long)(source_lo_offset >> 2));
  if (pvVar3->kind != PLAIN_DATA) {
    __assert_fail("hi_word.kind == LinkedWord::PLAIN_DATA",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0xaa,"void LinkedObjectFile::pointer_link_split_word(int, int, int, int, int)");
  }
  if (pvVar4->kind == PLAIN_DATA) {
    pvVar3->kind = HI_PTR;
    iVar1 = get_label_id_for(this,dest_segment,dest_offset);
    pvVar3->label_id = iVar1;
    pvVar4->kind = LO_PTR;
    pvVar4->label_id = iVar1;
    return;
  }
  __assert_fail("lo_word.kind == LinkedWord::PLAIN_DATA",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                ,0xab,"void LinkedObjectFile::pointer_link_split_word(int, int, int, int, int)");
}

Assistant:

void LinkedObjectFile::pointer_link_split_word(int source_segment,
                                               int source_hi_offset,
                                               int source_lo_offset,
                                               int dest_segment,
                                               int dest_offset) {
  assert((source_hi_offset % 4) == 0);
  assert((source_lo_offset % 4) == 0);

  auto& hi_word = words_by_seg.at(source_segment).at(source_hi_offset / 4);
  auto& lo_word = words_by_seg.at(source_segment).at(source_lo_offset / 4);

  //  assert(dest_offset / 4 <= (int)words_by_seg.at(dest_segment).size());
  assert(hi_word.kind == LinkedWord::PLAIN_DATA);
  assert(lo_word.kind == LinkedWord::PLAIN_DATA);

  hi_word.kind = LinkedWord::HI_PTR;
  hi_word.label_id = get_label_id_for(dest_segment, dest_offset);

  lo_word.kind = LinkedWord::LO_PTR;
  lo_word.label_id = hi_word.label_id;
}